

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::compute_diff_into(char *result,char *ext1,char *ext2)

{
  int iVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000050;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = get_neg(in_RSI);
  iVar2 = get_neg(in_RDX);
  if (iVar1 == iVar2) {
    compute_abs_diff_into(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    iVar2 = get_neg(in_RSI);
    if (iVar2 != 0) {
      negate((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
  }
  else {
    compute_abs_sum_into(in_stack_00000030,in_stack_00000028,result);
    iVar1 = is_zero(in_RDI);
    if (iVar1 == 0) {
      iVar1 = get_neg(in_RSI);
      set_neg(in_RDI,iVar1);
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_diff_into(char *result,
                                     const char *ext1, const char *ext2)
{
    /* check to see if the numbers have the same sign */
    if (get_neg(ext1) == get_neg(ext2))
    {
        /* 
         *   The two numbers have the same sign, so the difference is the
         *   difference in the magnitudes, and has a sign depending on the
         *   order of the difference and the signs of the original values.
         *   If both values are positive, the difference is negative if the
         *   second value is larger than the first.  If both values are
         *   negative, the difference is negative if the second value has
         *   larger absolute value than the first.  
         */

        /* compute the difference in magnitudes */
        compute_abs_diff_into(result, ext1, ext2);

        /* 
         *   if the original values were negative, then the sign of the
         *   result is the opposite of the sign of the difference of the
         *   absolute values; otherwise, it's the same as the sign of the
         *   difference of the absolute values 
         */
        if (get_neg(ext1))
            negate(result);
    }
    else
    {
        /* 
         *   one is positive and the other is negative - the result has the
         *   sign of the first operand, and has magnitude equal to the sum of
         *   the absolute values 
         */

        /* compute the sum of the absolute values */
        compute_abs_sum_into(result, ext1, ext2);

        /* set the sign of the result to that of the first operand */
        if (!is_zero(result))
            set_neg(result, get_neg(ext1));
    }
}